

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void nni_sha1(void *msg,size_t length,uint8_t *digest)

{
  undefined1 local_88 [8];
  nni_sha1_ctx ctx;
  uint8_t *digest_local;
  size_t length_local;
  void *msg_local;
  
  ctx._96_8_ = digest;
  nni_sha1_init((nni_sha1_ctx *)local_88);
  nni_sha1_update((nni_sha1_ctx *)local_88,msg,length);
  nni_sha1_final((nni_sha1_ctx *)local_88,(uint8_t *)ctx._96_8_);
  return;
}

Assistant:

void
nni_sha1(const void *msg, size_t length, uint8_t digest[20])
{
	nni_sha1_ctx ctx;

	nni_sha1_init(&ctx);
	nni_sha1_update(&ctx, msg, length);
	nni_sha1_final(&ctx, digest);
}